

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O2

void iutest::Test::RecordProperty<char_const*>(string *key,char **value)

{
  char **in_RDX;
  string local_30;
  
  PrintToString<char_const*>(&local_30,(iutest *)value,in_RDX);
  RecordPropertyString(key,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }